

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

void __thiscall Memory::allocate_memory(Memory *this,size_t mem_size)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  int *piVar3;
  string local_68;
  string local_48;
  char *local_28;
  char *target;
  
  this->size = mem_size;
  local_28 = (char *)0x0;
  if (this->superpage == true) {
    __stream = fopen((this->hugetlbfs_mountpoint)._M_dataplus._M_p,"w+");
    if (__stream == (FILE *)0x0) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Could not mount superpage from %s. Error:","");
      format_string<char_const*>(&local_48,&local_68,(this->hugetlbfs_mountpoint)._M_dataplus._M_p);
      Logger::log_info(&local_48,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,pcVar2,(allocator<char> *)&local_68);
      Logger::log_data(&local_48,true);
      std::__cxx11::string::~string((string *)&local_48);
      exit(1);
    }
    pcVar2 = this->start_address;
    iVar1 = fileno(__stream);
    pcVar2 = (char *)mmap(pcVar2,0x40000000,3,0x78040021,iVar1,0);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      allocate_memory();
LAB_00146d83:
      __assert_fail("madvise((void *) target, MEM_SIZE, MADV_HUGEPAGE)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/src/Memory/Memory.cpp"
                    ,0x1d,"void Memory::allocate_memory(size_t)");
    }
  }
  else {
    iVar1 = posix_memalign(&local_28,0x40000000,0x40000000);
    if (iVar1 != 0) {
      __assert_fail("posix_memalign((void **) &target, MEM_SIZE, MEM_SIZE)==0",
                    "/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/src/Memory/Memory.cpp"
                    ,0x1c,"void Memory::allocate_memory(size_t)");
    }
    iVar1 = madvise(local_28,0x40000000,0xe);
    if (iVar1 != 0) goto LAB_00146d83;
    memset(local_28,0x41,0x40000000);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Waiting for khugepaged.","");
    Logger::log_info(&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    sleep(10);
    pcVar2 = local_28;
  }
  local_28 = pcVar2;
  if (local_28 != this->start_address) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Could not create mmap area at address %p, instead using %p.","")
    ;
    format_string<char_volatile*,char_volatile*>(&local_48,&local_68,this->start_address,local_28);
    Logger::log_error(&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    this->start_address = local_28;
  }
  initialize(this,RANDOM);
  return;
}

Assistant:

void Memory::allocate_memory(size_t mem_size) {
  this->size = mem_size;
  volatile char *target = nullptr;
  FILE *fp;

  if (superpage) {
    // allocate memory using super pages
    fp = fopen(hugetlbfs_mountpoint.c_str(), "w+");
    if (fp==nullptr) {
      Logger::log_info(format_string("Could not mount superpage from %s. Error:", hugetlbfs_mountpoint.c_str()));
      Logger::log_data(std::strerror(errno));
      exit(EXIT_FAILURE);
    }
    auto mapped_target = mmap((void *) start_address, MEM_SIZE, PROT_READ | PROT_WRITE,
        MAP_SHARED | MAP_ANONYMOUS | MAP_HUGETLB | (30UL << MAP_HUGE_SHIFT), fileno(fp), 0);
    if (mapped_target==MAP_FAILED) {
      perror("mmap");
      exit(EXIT_FAILURE);
    }
    target = (volatile char*) mapped_target;
  } else {
    // allocate memory using huge pages
    assert(posix_memalign((void **) &target, MEM_SIZE, MEM_SIZE)==0);
    assert(madvise((void *) target, MEM_SIZE, MADV_HUGEPAGE)==0);
    memset((char *) target, 'A', MEM_SIZE);
    // for khugepaged
    Logger::log_info("Waiting for khugepaged.");
    sleep(10);
  }

  if (target!=start_address) {
    Logger::log_error(format_string("Could not create mmap area at address %p, instead using %p.",
        start_address, target));
    start_address = target;
  }

  // initialize memory with random but reproducible sequence of numbers
  initialize(DATA_PATTERN::RANDOM);
}